

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

FILE * libxml_PyFileGet(PyObject *f)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *local_30;
  char *mode;
  FILE *res;
  int flags;
  int fd;
  PyObject *f_local;
  
  iVar1 = PyObject_AsFileDescriptor(f);
  uVar2 = fcntl64(iVar1,3,0);
  uVar3 = uVar2 & 3;
  if (uVar3 == 0) {
    if ((uVar2 & 0x400) == 0) {
      local_30 = "r";
    }
    else {
      local_30 = "r+";
    }
  }
  else if (uVar3 == 1) {
    if ((uVar2 & 0x400) == 0) {
      local_30 = "w";
    }
    else {
      local_30 = "a";
    }
  }
  else {
    if (uVar3 != 2) {
      return (FILE *)0x0;
    }
    if ((uVar2 & 0x400) == 0) {
      local_30 = "rw";
    }
    else {
      local_30 = "a+";
    }
  }
  iVar1 = dup(iVar1);
  if (iVar1 == -1) {
    f_local = (PyObject *)0x0;
  }
  else {
    f_local = (PyObject *)fdopen(iVar1,local_30);
    if ((FILE *)f_local == (FILE *)0x0) {
      close(iVar1);
      f_local = (PyObject *)0x0;
    }
  }
  return (FILE *)f_local;
}

Assistant:

FILE *
libxml_PyFileGet(PyObject *f) {
    int fd, flags;
    FILE *res;
    const char *mode;

    fd = PyObject_AsFileDescriptor(f);
    /*
     * Get the flags on the fd to understand how it was opened
     */
    flags = fcntl(fd, F_GETFL, 0);
    switch (flags & O_ACCMODE) {
        case O_RDWR:
	    if (flags & O_APPEND)
	        mode = "a+";
	    else
	        mode = "rw";
	    break;
        case O_RDONLY:
	    if (flags & O_APPEND)
	        mode = "r+";
	    else
	        mode = "r";
	    break;
	case O_WRONLY:
	    if (flags & O_APPEND)
	        mode = "a";
	    else
	        mode = "w";
	    break;
	default:
	    return(NULL);
    }

    /*
     * the FILE struct gets a new fd, so that it can be closed
     * independently of the file descriptor given. The risk though is
     * lack of sync. So at the python level sync must be implemented
     * before and after a conversion took place. No way around it
     * in the Python3 infrastructure !
     * The duplicated fd and FILE * will be released in the subsequent
     * call to libxml_PyFileRelease() which must be generated accordingly
     */
    fd = dup(fd);
    if (fd == -1)
        return(NULL);
    res = fdopen(fd, mode);
    if (res == NULL) {
        close(fd);
	return(NULL);
    }
    return(res);
}